

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O1

void h2o_delegate_request(h2o_req_t *req,h2o_handler_t *current_handler)

{
  uint64_t *puVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  h2o_handler_t **pphVar5;
  h2o_handler_t **handler;
  
  handler = (req->pathconf->handlers).entries;
  sVar2 = (req->pathconf->handlers).size;
  if (sVar2 != 0) {
    lVar4 = sVar2 * 8;
    pphVar5 = handler;
    while( true ) {
      lVar4 = lVar4 + -8;
      handler = pphVar5 + 1;
      if (*pphVar5 == current_handler) break;
      pphVar5 = handler;
      if (lVar4 == 0) {
        call_handlers(req,handler);
        return;
      }
    }
  }
  sVar2 = (req->pathconf->handlers).size;
  pphVar5 = (req->pathconf->handlers).entries;
  while( true ) {
    if (pphVar5 + sVar2 == handler) {
      puVar1 = req->conn->ctx->emitted_error_status + 2;
      *puVar1 = *puVar1 + 1;
      h2o_send_error_generic(req,0x194,"File Not Found","not found",0);
      return;
    }
    iVar3 = (*(*handler)->on_req)(*handler,req);
    if (iVar3 == 0) break;
    handler = handler + 1;
  }
  return;
}

Assistant:

void h2o_delegate_request(h2o_req_t *req, h2o_handler_t *current_handler)
{
    h2o_handler_t **handler = req->pathconf->handlers.entries, **end = handler + req->pathconf->handlers.size;

    for (; handler != end; ++handler) {
        if (*handler == current_handler) {
            ++handler;
            break;
        }
    }
    call_handlers(req, handler);
}